

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Record.cpp
# Opt level: O0

void __thiscall ki::dml::Record::~Record(Record *this)

{
  bool bVar1;
  reference ppFVar2;
  __normal_iterator<ki::dml::FieldBase_**,_std::vector<ki::dml::FieldBase_*,_std::allocator<ki::dml::FieldBase_*>_>_>
  local_20;
  __normal_iterator<ki::dml::FieldBase_**,_std::vector<ki::dml::FieldBase_*,_std::allocator<ki::dml::FieldBase_*>_>_>
  local_18;
  iterator it;
  Record *this_local;
  
  it._M_current = (FieldBase **)this;
  local_18._M_current =
       (FieldBase **)
       std::vector<ki::dml::FieldBase_*,_std::allocator<ki::dml::FieldBase_*>_>::begin
                 (&this->m_fields);
  while( true ) {
    local_20._M_current =
         (FieldBase **)
         std::vector<ki::dml::FieldBase_*,_std::allocator<ki::dml::FieldBase_*>_>::end
                   (&this->m_fields);
    bVar1 = __gnu_cxx::operator!=(&local_18,&local_20);
    if (!bVar1) break;
    ppFVar2 = __gnu_cxx::
              __normal_iterator<ki::dml::FieldBase_**,_std::vector<ki::dml::FieldBase_*,_std::allocator<ki::dml::FieldBase_*>_>_>
              ::operator*(&local_18);
    if (*ppFVar2 != (FieldBase *)0x0) {
      (*((*ppFVar2)->super_Serializable)._vptr_Serializable[4])();
    }
    __gnu_cxx::
    __normal_iterator<ki::dml::FieldBase_**,_std::vector<ki::dml::FieldBase_*,_std::allocator<ki::dml::FieldBase_*>_>_>
    ::operator++(&local_18);
  }
  std::vector<ki::dml::FieldBase_*,_std::allocator<ki::dml::FieldBase_*>_>::clear(&this->m_fields);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ki::dml::FieldBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ki::dml::FieldBase_*>_>_>
  ::clear(&this->m_field_map);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ki::dml::FieldBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ki::dml::FieldBase_*>_>_>
  ::~map(&this->m_field_map);
  std::vector<ki::dml::FieldBase_*,_std::allocator<ki::dml::FieldBase_*>_>::~vector(&this->m_fields)
  ;
  return;
}

Assistant:

Record::~Record()
	{
		for (auto it = m_fields.begin(); it != m_fields.end(); ++it)
			delete *it;
		m_fields.clear();
		m_field_map.clear();
	}